

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

void __thiscall
CCoinsViewCache::AddCoin
          (CCoinsViewCache *this,COutPoint *outpoint,Coin *coin,bool possible_overwrite)

{
  CScript *pCVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> _Var8;
  ulong uVar9;
  logic_error *this_00;
  ulong uVar10;
  CScript *pCVar11;
  byte bVar12;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar13;
  undefined1 local_41;
  COutPoint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((coin->out).nValue == -1) {
    __assert_fail("!coin.IsSpent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                  ,0x47,"void CCoinsViewCache::AddCoin(const COutPoint &, Coin &&, bool)");
  }
  pCVar1 = &(coin->out).scriptPubKey;
  uVar3 = (coin->out).scriptPubKey.super_CScriptBase._size;
  uVar7 = uVar3 - 0x1d;
  if (uVar3 < 0x1d) {
    uVar7 = uVar3;
  }
  if (uVar7 == 0) {
LAB_00686401:
    local_40 = outpoint;
    pVar13 = std::
             _Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::
             _M_emplace<std::piecewise_construct_t_const&,std::tuple<COutPoint_const&>,std::tuple<>>
                       ((_Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->cacheCoins,&std::piecewise_construct,&local_40,&local_41);
    _Var8 = pVar13.first.
            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur;
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar10 = (ulong)*(uint *)((long)_Var8.
                                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                      ._M_cur + 0x58);
      if (*(uint *)((long)_Var8.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur + 0x6c) < 0x1d) {
        uVar10 = 0;
      }
      uVar9 = 0;
      if ((int)uVar10 != 0) {
        uVar9 = uVar10 + 0x1f & 0x1fffffff0;
      }
      this->cachedCoinsUsage = this->cachedCoinsUsage - uVar9;
    }
    bVar12 = 1;
    if (!possible_overwrite) {
      if (*(long *)((long)_Var8.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur + 0x48) != -1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,
                   "Attempted to overwrite an unspent coin (when possible_overwrite is false)");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        goto LAB_006865ce;
      }
      bVar12 = ((*(byte *)((long)_Var8.
                                 super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                 ._M_cur + 0x40) & 1) == 0) * '\x02' + 1;
    }
    *(CAmount *)
     ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
            _M_cur + 0x48) = (coin->out).nValue;
    if (0x1c < *(uint *)((long)_Var8.
                               super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                               ._M_cur + 0x6c)) {
      free(*(void **)((long)_Var8.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x50));
    }
    pcVar4 = (pCVar1->super_CScriptBase)._union.indirect_contents.indirect;
    uVar5 = *(undefined8 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 8);
    uVar6 = *(undefined8 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0x14);
    *(undefined8 *)
     ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
            _M_cur + 0x5c) =
         *(undefined8 *)((long)&(coin->out).scriptPubKey.super_CScriptBase._union + 0xc);
    *(undefined8 *)
     ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
            _M_cur + 100) = uVar6;
    *(char **)((long)_Var8.
                     super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                     _M_cur + 0x50) = pcVar4;
    *(undefined8 *)
     ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
            _M_cur + 0x58) = uVar5;
    *(size_type *)
     ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
            _M_cur + 0x6c) = (coin->out).scriptPubKey.super_CScriptBase._size;
    (coin->out).scriptPubKey.super_CScriptBase._size = 0;
    *(undefined4 *)
     ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
            _M_cur + 0x70) = *(undefined4 *)&coin->field_0x28;
    bVar2 = *(byte *)((long)_Var8.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x40);
    if (bVar2 == 0) {
      *(CoinsCachePair **)
       ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x30) = (this->m_sentinel).second.m_prev;
      *(CoinsCachePair **)
       ((long)_Var8.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x38) = &this->m_sentinel;
      (this->m_sentinel).second.m_prev =
           (CoinsCachePair *)
           ((long)_Var8.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur + 8);
      *(CoinsCachePair **)
       (*(long *)((long)_Var8.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x30) + 0x30) =
           (CoinsCachePair *)
           ((long)_Var8.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur + 8);
    }
    *(byte *)((long)_Var8.
                    super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                    _M_cur + 0x40) = bVar2 | bVar12;
    uVar10 = (ulong)*(uint *)((long)_Var8.
                                    super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                    ._M_cur + 0x58);
    if (*(uint *)((long)_Var8.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x6c) < 0x1d) {
      uVar10 = 0;
    }
    uVar9 = 0;
    if ((int)uVar10 != 0) {
      uVar9 = uVar10 + 0x1f & 0x1fffffff0;
    }
    this->cachedCoinsUsage = this->cachedCoinsUsage + uVar9;
  }
  else {
    pCVar11 = pCVar1;
    if (0x1c < uVar3) {
      pCVar11 = (CScript *)(pCVar1->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if ((uVar7 < 0x2711) && ((pCVar11->super_CScriptBase)._union.direct[0] != 'j'))
    goto LAB_00686401;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_006865ce:
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::AddCoin(const COutPoint &outpoint, Coin&& coin, bool possible_overwrite) {
    assert(!coin.IsSpent());
    if (coin.out.scriptPubKey.IsUnspendable()) return;
    CCoinsMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = cacheCoins.emplace(std::piecewise_construct, std::forward_as_tuple(outpoint), std::tuple<>());
    bool fresh = false;
    if (!inserted) {
        cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
    }
    if (!possible_overwrite) {
        if (!it->second.coin.IsSpent()) {
            throw std::logic_error("Attempted to overwrite an unspent coin (when possible_overwrite is false)");
        }
        // If the coin exists in this cache as a spent coin and is DIRTY, then
        // its spentness hasn't been flushed to the parent cache. We're
        // re-adding the coin to this cache now but we can't mark it as FRESH.
        // If we mark it FRESH and then spend it before the cache is flushed
        // we would remove it from this cache and would never flush spentness
        // to the parent cache.
        //
        // Re-adding a spent coin can happen in the case of a re-org (the coin
        // is 'spent' when the block adding it is disconnected and then
        // re-added when it is also added in a newly connected block).
        //
        // If the coin doesn't exist in the current cache, or is spent but not
        // DIRTY, then it can be marked FRESH.
        fresh = !it->second.IsDirty();
    }
    it->second.coin = std::move(coin);
    it->second.AddFlags(CCoinsCacheEntry::DIRTY | (fresh ? CCoinsCacheEntry::FRESH : 0), *it, m_sentinel);
    cachedCoinsUsage += it->second.coin.DynamicMemoryUsage();
    TRACE5(utxocache, add,
           outpoint.hash.data(),
           (uint32_t)outpoint.n,
           (uint32_t)it->second.coin.nHeight,
           (int64_t)it->second.coin.out.nValue,
           (bool)it->second.coin.IsCoinBase());
}